

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O3

void __thiscall
vector_block<unsigned_char_*,_1024U>::~vector_block(vector_block<unsigned_char_*,_1024U> *this)

{
  pointer pppuVar1;
  ulong uVar2;
  
  pppuVar1 = (this->_index_block).
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppuVar1) {
    uVar2 = 0;
    do {
      free(pppuVar1[uVar2]);
      uVar2 = uVar2 + 1;
      pppuVar1 = (this->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_index_block).
                                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pppuVar1 >> 3)
            );
  }
  if (pppuVar1 != (pointer)0x0) {
    operator_delete(pppuVar1);
    return;
  }
  return;
}

Assistant:

~vector_block()
	{
		for (size_t i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
	}